

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O1

void __thiscall TargetImageWidget::LoadImage(TargetImageWidget *this,QString *fileName)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QArrayData *local_68 [2];
  undefined8 local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined8 local_20;
  
  cVar2 = QImage::load((QString *)&this->image_,(char *)fileName);
  if (cVar2 != '\0') {
    PanAndZoomWidget::ResetView(&this->super_PanAndZoomWidget);
    PanAndZoomWidget::ResetTranslation(&this->super_PanAndZoomWidget);
    onFitToTargetRequested(this);
    lVar4 = QImage::size();
    if (lVar4 == 0x100000001000) {
      QVar5.m_data = (storage_type *)0x12;
      QVar5.m_size = (qsizetype)&local_30;
      QString::fromUtf8(QVar5);
      local_68[0] = (QArrayData *)CONCAT44(uStack_2c,local_30);
      local_58 = local_20;
      QVar6.m_data = (storage_type *)0x62;
      QVar6.m_size = (qsizetype)&local_30;
      QString::fromUtf8(QVar6);
      local_48 = local_30;
      uStack_44 = uStack_2c;
      uStack_40 = uStack_28;
      uStack_3c = uStack_24;
      local_38 = local_20;
      iVar3 = QMessageBox::question(this,local_68,&local_48,0x14000,0);
      piVar1 = (int *)CONCAT44(uStack_44,local_48);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_44,local_48),2,8);
        }
      }
      if (local_68[0] != (QArrayData *)0x0) {
        LOCK();
        (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68[0],2,8);
        }
      }
      if (iVar3 == 0x4000) {
        onUseWholeImageRequested(this);
      }
    }
  }
  return;
}

Assistant:

void TargetImageWidget::LoadImage(QString fileName)
{
    if (image_.load(fileName)) {
        ResetView();
        onResetTranslationRequested();
        onFitToTargetRequested();

        if (image_.size() == QSize(4096, 4096)) {
            int response = QMessageBox::question(this, "Skip modification?", "This image is already 4096 * 4096 pixels, would you like to set this as the target image directly?");
            if (response == QMessageBox::StandardButton::Yes) {
                emit onUseWholeImageRequested();
            }
        }
    }
}